

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O3

void __thiscall
wasm::RandomElement<wasm::RandomFullLattice>::RandomElement
          (RandomElement<wasm::RandomFullLattice> *this,
          RandomElement<wasm::RandomFullLattice> *other)

{
  _Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  *this_00;
  _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  local_78;
  _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  local_50;
  anon_class_8_1_a78179b7_conflict local_28;
  
  std::__detail::__variant::
  _Copy_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                     *)&local_78,
                    (_Copy_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                     *)(other->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                       super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                       super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                       super__Head_base<0UL,_void_*,_false>._M_head_impl);
  local_28.__lhs =
       (_Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
        *)&local_50;
  local_50._M_index = local_78._M_index;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>_&&>
    ::_S_vtable._M_arr[(long)(char)local_78._M_index + 1]._M_data)
            (&local_28,
             (variant<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
              *)&local_78);
  std::__detail::__variant::
  _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  ::~_Variant_storage(&local_78);
  this_00 = (_Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
             *)operator_new(0x28);
  std::__detail::__variant::
  _Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  ::_Move_ctor_base(this_00,(_Move_ctor_base<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                             *)&local_50);
  (this->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false> =
       (_Head_base<1UL,_void_(*)(void_*),_false>)RandomElement::anon_class_1_0_00000001::__invoke;
  (this->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>._M_head_impl
       = this_00;
  std::__detail::__variant::
  _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  ::~_Variant_storage(&local_50);
  return;
}

Assistant:

RandomElement(const RandomElement& other)
    : RandomElement([&]() {
        auto copy = *other;
        return copy;
      }()) {}